

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Texture.cpp
# Opt level: O3

uint32_t __thiscall
GmmLib::GmmGen12TextureCalc::Get2DMipMapHeight(GmmGen12TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  GMM_PLATFORM_INFO *pGVar4;
  undefined4 extraout_var;
  anon_struct_8_44_94931171_for_Info aVar5;
  uint32_t uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint32_t local_60;
  uint32_t local_5c;
  uint32_t CompressWidth;
  uint32_t CompressDepth;
  GMM_PLATFORM_INFO *local_50;
  ulong local_48;
  uint local_3c;
  uint32_t local_38;
  uint32_t CompressHeight;
  
  pGVar4 = GmmGetPlatformInfo((this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.
                              super_GmmGen9TextureCalc.super_GmmTextureCalc.pGmmLibContext);
  CompressHeight._3_1_ =
       GmmIsCompressed((this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.
                       super_GmmGen9TextureCalc.super_GmmTextureCalc.pGmmLibContext,pTexInfo->Format
                      );
  uVar1 = pTexInfo->BaseHeight;
  local_38 = pTexInfo->MaxLod;
  local_48 = (ulong)(pTexInfo->Alignment).VAlign;
  GmmTextureCalc::GetCompressionBlockDimensions
            ((GmmTextureCalc *)this,pTexInfo->Format,&local_60,&local_3c,&local_5c);
  if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
    uVar2 = 1;
  }
  else {
    uVar2 = (pTexInfo->MSAA).NumSamples;
  }
  uVar1 = GmmTextureCalc::ExpandHeight((GmmTextureCalc *)this,uVar1,(uint32_t)local_48,uVar2);
  _CompressWidth = CONCAT44(extraout_var,uVar1);
  if (CompressHeight._3_1_ != '\0') {
    _CompressWidth = (ulong)uVar1 / (ulong)local_3c;
  }
  aVar5 = (pTexInfo->Flags).Info;
  if ((((ulong)aVar5 & 0x106000000000) != 0) &&
     (((pTexInfo->Alignment).MipTailStartLod == 0 || (pTexInfo->MaxLod == 0)))) goto LAB_001a8b98;
  local_50 = pGVar4;
  if (local_38 == 0) {
    uVar1 = 0;
    uVar9 = 0;
    if (((ulong)aVar5 & 0x106000000000) == 0) {
LAB_001a8b87:
      iVar3 = (int)_CompressWidth;
      iVar7 = (int)local_48;
      uVar9 = iVar7 + -1 + uVar1;
      goto LAB_001a8b90;
    }
  }
  else {
    uVar8 = 1;
    uVar1 = 0;
    uVar9 = 0;
    do {
      aVar5 = (pTexInfo->Flags).Info;
      if ((((ulong)aVar5 & 0x106000000000) != 0) && (uVar8 == (pTexInfo->Alignment).MipTailStartLod)
         ) {
        uVar2 = local_50->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        if (uVar8 == 1) {
          uVar1 = uVar2;
          uVar2 = 0;
        }
        uVar9 = uVar9 + uVar2;
        goto LAB_001a8b39;
      }
      uVar2 = (*(this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.super_GmmGen9TextureCalc
                .super_GmmTextureCalc._vptr_GmmTextureCalc[0x19])(this,pTexInfo,(ulong)uVar8);
      if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
        uVar6 = 1;
      }
      else {
        uVar6 = (pTexInfo->MSAA).NumSamples;
      }
      uVar2 = GmmTextureCalc::ExpandHeight((GmmTextureCalc *)this,uVar2,(uint32_t)local_48,uVar6);
      if (CompressHeight._3_1_ != '\0') {
        uVar2 = uVar2 / local_3c;
      }
      uVar6 = uVar2;
      if (uVar8 == 1) {
        uVar6 = 0;
        uVar1 = uVar2;
      }
      uVar9 = uVar9 + uVar6;
      uVar8 = uVar8 + 1;
    } while (uVar8 <= local_38);
    aVar5 = (pTexInfo->Flags).Info;
LAB_001a8b39:
    iVar3 = (int)_CompressWidth;
    if (((ulong)aVar5 & 0x106000000000) == 0) {
      if (uVar9 <= uVar1) goto LAB_001a8b87;
      iVar7 = (int)local_48;
      uVar9 = iVar7 + -1 + uVar9;
LAB_001a8b90:
      _CompressWidth = (ulong)((-iVar7 & uVar9) + iVar3);
      goto LAB_001a8b98;
    }
  }
  if (uVar9 < uVar1) {
    uVar9 = uVar1;
  }
  uVar1 = local_50->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
  _CompressWidth = (ulong)(-uVar1 & (uVar1 - 1) + (int)_CompressWidth + uVar9);
LAB_001a8b98:
  return (uint32_t)_CompressWidth;
}

Assistant:

uint32_t GmmLib::GmmGen12TextureCalc::Get2DMipMapHeight(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t BlockHeight, MipHeight;
    uint32_t HeightLinesLevel0, HeightLinesLevel1, HeightLinesLevel2;
    uint32_t i, MipLevel, VAlign, CompressHeight, CompressWidth, CompressDepth;
    uint8_t  Compressed;
    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    Compressed = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
    MipHeight  = pTexInfo->BaseHeight;
    MipLevel   = pTexInfo->MaxLod;
    VAlign     = pTexInfo->Alignment.VAlign;
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    HeightLinesLevel0 = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

    if(Compressed)
    {
        HeightLinesLevel0 /= CompressHeight;
    }

    // Mip0 height...
    BlockHeight = HeightLinesLevel0;

    if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
       ((pTexInfo->Alignment.MipTailStartLod == 0) || (pTexInfo->MaxLod == 0)))
    {
        // Do nothing. Height is already aligned.
    }
    else
    {
        // Height of Mip1 and Mip2..n needed later...
        HeightLinesLevel1 = HeightLinesLevel2 = 0;
        for(i = 1; i <= MipLevel; i++)
        {
            uint32_t AlignedHeightLines;

            if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
               (i == pTexInfo->Alignment.MipTailStartLod))
            {
                AlignedHeightLines = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight;

                if(i == 1)
                {
                    HeightLinesLevel1 = AlignedHeightLines;
                }
                else
                {
                    HeightLinesLevel2 += AlignedHeightLines;
                }

                break;
            }
            else
            {
                MipHeight = GmmTexGetMipHeight(pTexInfo, i);

                AlignedHeightLines = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

                if(Compressed)
                {
                    AlignedHeightLines /= CompressHeight;
                }

                if(i == 1)
                {
                    HeightLinesLevel1 = AlignedHeightLines;
                }
                else
                {
                    HeightLinesLevel2 += AlignedHeightLines;
                }
            }
        }

        // If Mip1 height covers all others, then that is all we need...
        if(!(pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)))
        {
            if(HeightLinesLevel1 >= HeightLinesLevel2)
            {
                BlockHeight += GFX_ALIGN(HeightLinesLevel1, VAlign);
            }
            else
            {
                BlockHeight += GFX_ALIGN(HeightLinesLevel2, VAlign);
            }
        }
        else
        {
            //TR mode- requires TileMode height alignment
            BlockHeight += (HeightLinesLevel1 >= HeightLinesLevel2) ? HeightLinesLevel1 : HeightLinesLevel2;
            BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
        }
    }

    GMM_DPF_EXIT;

    return (BlockHeight);
}